

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

void keccak_init(keccak_state *s,uint hashbits,uint ratebits,uchar first_pad_byte)

{
  int local_24;
  int local_20;
  int y;
  int x;
  uchar first_pad_byte_local;
  uint ratebits_local;
  uint hashbits_local;
  keccak_state *s_local;
  
  if ((hashbits & 7) != 0) {
    __assert_fail("hashbits % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha3.c",
                  0x95,"void keccak_init(keccak_state *, unsigned int, unsigned int, unsigned char)"
                 );
  }
  if ((ratebits & 7) == 0) {
    s->hash_bytes = (ulong)(hashbits >> 3);
    s->bytes_wanted = (ulong)(0x640 - ratebits >> 3);
    s->bytes_got = 0;
    s->first_pad_byte = first_pad_byte;
    if ((s->bytes_wanted & 7) == 0) {
      for (local_24 = 0; local_24 < 5; local_24 = local_24 + 1) {
        for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
          s->A[local_20][local_24] = 0;
        }
      }
      return;
    }
    __assert_fail("s->bytes_wanted % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha3.c",
                  0x9d,"void keccak_init(keccak_state *, unsigned int, unsigned int, unsigned char)"
                 );
  }
  __assert_fail("ratebits % 8 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha3.c",
                0x96,"void keccak_init(keccak_state *, unsigned int, unsigned int, unsigned char)");
}

Assistant:

static void keccak_init(keccak_state *s, unsigned hashbits, unsigned ratebits,
                        unsigned char first_pad_byte)
{
    int x, y;

    assert(hashbits % 8 == 0);
    assert(ratebits % 8 == 0);

    s->hash_bytes = hashbits / 8;
    s->bytes_wanted = (25 * 64 - ratebits) / 8;
    s->bytes_got = 0;
    s->first_pad_byte = first_pad_byte;

    assert(s->bytes_wanted % 8 == 0);

    for (y = 0; y < 5; y++)
        for (x = 0; x < 5; x++)
            s->A[x][y] = 0;
}